

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTList * ParseArgs(Scope *scope,Lexer *lexer)

{
  Token tok_00;
  char *pcVar1;
  ASTList *pAVar2;
  ASTListItem *pAVar3;
  ASTNode *pAVar4;
  ASTListItem *item;
  ASTList *list;
  Token tok;
  Lexer *lexer_local;
  Scope *scope_local;
  
  tok_00 = GetNextToken(lexer);
  if (tok_00 != LPAREN) {
    pcVar1 = TokenToString(tok_00);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar1,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  pAVar2 = GetNextASTList(scope);
  list._4_4_ = LPAREN;
  while (list._4_4_ != RPAREN) {
    pAVar3 = GetNextASTListItem(scope);
    pAVar4 = ParseExpression(scope,lexer);
    pAVar3->node = pAVar4;
    pAVar3->prev = pAVar2->current;
    if (pAVar2->current != (ASTListItem *)0x0) {
      pAVar2->current->next = pAVar3;
    }
    pAVar2->current = pAVar3;
    if (pAVar2->first == (ASTListItem *)0x0) {
      pAVar2->first = pAVar3;
    }
    list._4_4_ = GetCurrentToken(lexer);
  }
  pAVar2->last = pAVar2->current;
  return pAVar2;
}

Assistant:

ASTList* ParseArgs(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Func Args");
	TRACK();
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	ASTList* list = GetNextASTList(scope);

	while (tok != RPAREN){
		// tok = GetNextToken(lexer);
		ASTListItem* item = GetNextASTListItem(scope);
		item->node = ParseExpression(scope, lexer);
		item->prev = list->current;

		if (list->current != NULL) list->current->next = item;

		list->current = item;
		if (list->first == NULL) list->first = item;
		tok = GetCurrentToken(lexer);
	}
	list->last = list->current;

	return list;
}